

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

GlobalStateInfo
Fossilize::Hashing::parse_global_state_info
          (VkGraphicsPipelineCreateInfo *create_info,DynamicStateInfo *dynamic_info,
          SubpassMeta *meta)

{
  VkShaderStageFlagBits VVar1;
  GlobalStateInfo GVar2;
  VkGraphicsPipelineLibraryFlagsEXT flags;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  byte local_55;
  byte local_54;
  byte local_53;
  bool local_51;
  undefined4 uStack_49;
  uint local_3c;
  uint32_t i;
  bool rasterizer_discard;
  VkGraphicsPipelineLibraryFlagsEXT state_flags;
  SubpassMeta *meta_local;
  DynamicStateInfo *dynamic_info_local;
  VkGraphicsPipelineCreateInfo *create_info_local;
  undefined1 uStack_10;
  byte bStack_f;
  byte bStack_e;
  byte bStack_d;
  bool bStack_c;
  GlobalStateInfo info;
  
  memset((void *)((long)&create_info_local + 5),0,0xb);
  bStack_c = create_info->pRasterizationState != (VkPipelineRasterizationStateCreateInfo *)0x0;
  info.input_assembly = true;
  info.viewport_state = true;
  info.tessellation_state = true;
  flags = graphics_pipeline_get_effective_state_flags(create_info);
  bVar3 = create_info->pRasterizationState != (VkPipelineRasterizationStateCreateInfo *)0x0;
  bVar4 = (flags & 2) != 0;
  local_51 = bVar3 && bVar4;
  bStack_c = local_51;
  bVar5 = false;
  if (((dynamic_info->rasterizer_discard_enable & 1U) == 0) && (bVar5 = false, bVar3 && bVar4)) {
    bVar5 = create_info->pRasterizationState->rasterizerDiscardEnable == 1;
  }
  if (!bVar5) {
    create_info_local._7_1_ =
         create_info->pViewportState != (VkPipelineViewportStateCreateInfo *)0x0;
    uStack_10 = create_info->pMultisampleState != (VkPipelineMultisampleStateCreateInfo *)0x0;
    local_53 = 0;
    if (create_info->pColorBlendState != (VkPipelineColorBlendStateCreateInfo *)0x0) {
      local_53 = meta->uses_color;
    }
    bStack_e = local_53 & 1;
    local_54 = 0;
    if (create_info->pDepthStencilState != (VkPipelineDepthStencilStateCreateInfo *)0x0) {
      local_54 = meta->uses_depth_stencil;
    }
    bStack_f = local_54 & 1;
  }
  create_info_local._5_1_ =
       create_info->pInputAssemblyState != (VkPipelineInputAssemblyStateCreateInfo *)0x0;
  local_55 = 0;
  if (create_info->pVertexInputState != (VkPipelineVertexInputStateCreateInfo *)0x0) {
    local_55 = dynamic_info->vertex_input ^ 0xff;
  }
  bStack_d = local_55 & 1;
  bVar5 = graphics_pipeline_library_state_flags_have_module_state(flags);
  if (bVar5) {
    for (local_3c = 0; local_3c < create_info->stageCount; local_3c = local_3c + 1) {
      VVar1 = create_info->pStages[local_3c].stage;
      if ((VVar1 == VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT) ||
         (VVar1 == VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT)) {
        create_info_local._6_1_ =
             create_info->pTessellationState != (VkPipelineTessellationStateCreateInfo *)0x0;
      }
      else if ((VVar1 == VK_SHADER_STAGE_TASK_BIT_EXT) || (VVar1 == VK_SHADER_STAGE_MESH_BIT_EXT)) {
        create_info_local._5_1_ = 0;
        bStack_d = 0;
      }
    }
  }
  if ((flags & 1) == 0) {
    create_info_local._5_1_ = 0;
    bStack_d = 0;
  }
  if ((flags & 2) == 0) {
    create_info_local._7_1_ = 0;
    bStack_c = false;
    create_info_local._6_1_ = 0;
  }
  if ((flags & 4) == 0) {
    bStack_f = 0;
  }
  if ((flags & 0xc) == 0) {
    uStack_10 = 0;
  }
  if ((flags & 8) == 0) {
    bStack_e = 0;
  }
  if ((flags & 0xe) == 0) {
    info.input_assembly = false;
  }
  GVar2.tessellation_state = (bool)create_info_local._6_1_;
  GVar2.input_assembly = (bool)create_info_local._5_1_;
  GVar2.viewport_state = (bool)create_info_local._7_1_;
  GVar2.multisample_state = (bool)uStack_10;
  GVar2.depth_stencil_state = (bool)bStack_f;
  GVar2.color_blend_state = (bool)bStack_e;
  GVar2.vertex_input = (bool)bStack_d;
  uStack_49._1_3_ =
       (undefined3)(CONCAT13(bVar5,CONCAT12(bVar5,CONCAT11(info.input_assembly,bStack_c))) >> 8);
  GVar2.rasterization_state = bStack_c;
  GVar2.render_pass_state = (bool)uStack_49._1_1_;
  GVar2.layout_state = (bool)uStack_49._2_1_;
  GVar2.module_state = (bool)uStack_49._3_1_;
  return GVar2;
}

Assistant:

static GlobalStateInfo parse_global_state_info(const VkGraphicsPipelineCreateInfo &create_info,
                                               const DynamicStateInfo &dynamic_info,
                                               const StateRecorder::SubpassMeta &meta)
{
	GlobalStateInfo info = {};

	info.rasterization_state = create_info.pRasterizationState != nullptr;
	info.render_pass_state = true;
	info.module_state = true;
	info.layout_state = true;

	auto state_flags = graphics_pipeline_get_effective_state_flags(create_info);

	info.rasterization_state = create_info.pRasterizationState &&
	                           (state_flags & VK_GRAPHICS_PIPELINE_LIBRARY_PRE_RASTERIZATION_SHADERS_BIT_EXT) != 0;

	bool rasterizer_discard = !dynamic_info.rasterizer_discard_enable &&
	                          info.rasterization_state &&
	                          create_info.pRasterizationState->rasterizerDiscardEnable == VK_TRUE;

	if (!rasterizer_discard)
	{
		info.viewport_state = create_info.pViewportState != nullptr;
		info.multisample_state = create_info.pMultisampleState != nullptr;
		info.color_blend_state = create_info.pColorBlendState != nullptr && meta.uses_color;
		info.depth_stencil_state = create_info.pDepthStencilState != nullptr && meta.uses_depth_stencil;
	}

	info.input_assembly = create_info.pInputAssemblyState != nullptr;
	info.vertex_input = create_info.pVertexInputState != nullptr && !dynamic_info.vertex_input;

	info.module_state = graphics_pipeline_library_state_flags_have_module_state(state_flags);
	info.layout_state = info.module_state;

	if (info.module_state)
	{
		for (uint32_t i = 0; i < create_info.stageCount; i++)
		{
			switch (create_info.pStages[i].stage)
			{
			case VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT:
			case VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT:
				info.tessellation_state = create_info.pTessellationState != nullptr;
				break;

			case VK_SHADER_STAGE_MESH_BIT_EXT:
			case VK_SHADER_STAGE_TASK_BIT_EXT:
				info.input_assembly = false;
				info.vertex_input = false;
				break;

			default:
				break;
			}
		}
	}

	// If state is not part of the interface for a pipeline library, nop out that state explicitly.
	if ((state_flags & VK_GRAPHICS_PIPELINE_LIBRARY_VERTEX_INPUT_INTERFACE_BIT_EXT) == 0)
	{
		info.input_assembly = false;
		info.vertex_input = false;
	}

	if ((state_flags & VK_GRAPHICS_PIPELINE_LIBRARY_PRE_RASTERIZATION_SHADERS_BIT_EXT) == 0)
	{
		info.viewport_state = false;
		info.rasterization_state = false;
		info.tessellation_state = false;
	}

	if ((state_flags & VK_GRAPHICS_PIPELINE_LIBRARY_FRAGMENT_SHADER_BIT_EXT) == 0)
	{
		info.depth_stencil_state = false;
	}

	if ((state_flags & (
			VK_GRAPHICS_PIPELINE_LIBRARY_FRAGMENT_SHADER_BIT_EXT |
			VK_GRAPHICS_PIPELINE_LIBRARY_FRAGMENT_OUTPUT_INTERFACE_BIT_EXT)) == 0)
	{
		info.multisample_state = false;
	}

	if ((state_flags & VK_GRAPHICS_PIPELINE_LIBRARY_FRAGMENT_OUTPUT_INTERFACE_BIT_EXT) == 0)
		info.color_blend_state = false;

	// We can ignore formats for dynamic rendering if output interface isn't used, but that's too esoteric.
	// We're mostly interested in ignoring pointers which could be garbage.
	if ((state_flags & (
			VK_GRAPHICS_PIPELINE_LIBRARY_FRAGMENT_SHADER_BIT_EXT |
			VK_GRAPHICS_PIPELINE_LIBRARY_PRE_RASTERIZATION_SHADERS_BIT_EXT |
			VK_GRAPHICS_PIPELINE_LIBRARY_FRAGMENT_OUTPUT_INTERFACE_BIT_EXT)) == 0)
	{
		info.render_pass_state = false;
	}

	return info;
}